

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall xatlas::internal::BVH::query(BVH *this,AABB *queryAabb,Array<unsigned_int> *result)

{
  int iVar1;
  uint8_t *puVar2;
  bool bVar3;
  char *__function;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t todo [64];
  uint local_14c;
  uint local_138 [66];
  
  uVar4 = 0;
  (result->m_base).size = 0;
  local_138[0] = 0;
  do {
    uVar6 = local_138[uVar4];
    uVar7 = (ulong)uVar6;
    uVar5 = (this->m_nodes).m_base.size;
    if (uVar5 <= uVar6) goto LAB_001ae8ac;
    local_14c = uVar4 - 1;
    puVar2 = (this->m_nodes).m_base.buffer;
    iVar1 = *(int *)(puVar2 + uVar7 * 0x24 + 0x20);
    if (iVar1 == 0) {
      uVar4 = local_14c;
      if (*(int *)(puVar2 + uVar7 * 0x24 + 0x1c) != 0) {
        uVar6 = 0;
        do {
          uVar5 = *(int *)(puVar2 + uVar7 * 0x24 + 0x18) + uVar6;
          if ((this->m_objectIds).m_base.size <= uVar5) {
LAB_001ae87e:
            __function = 
            "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]"
            ;
            goto LAB_001ae8c1;
          }
          uVar8 = *(uint *)((this->m_objectIds).m_base.buffer + (ulong)uVar5 * 4);
          if ((this->m_objectAabbs->m_base).size <= uVar8) {
            __function = 
            "const T &xatlas::internal::Array<xatlas::internal::AABB>::operator[](uint32_t) const [T = xatlas::internal::AABB]"
            ;
            goto LAB_001ae8c1;
          }
          bVar3 = AABB::intersect(queryAabb,
                                  (AABB *)((this->m_objectAabbs->m_base).buffer +
                                          (ulong)uVar8 * 0x18));
          if (bVar3) {
            if ((this->m_objectIds).m_base.size <= uVar5) goto LAB_001ae87e;
            ArrayBase::push_back
                      (&result->m_base,(this->m_objectIds).m_base.buffer + (ulong)uVar5 * 4);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < *(uint *)(puVar2 + uVar7 * 0x24 + 0x1c));
      }
    }
    else {
      uVar8 = uVar6 + 1;
      if (uVar5 <= uVar8) {
LAB_001ae8ac:
        __function = 
        "const T &xatlas::internal::Array<xatlas::internal::BVH::Node>::operator[](uint32_t) const [T = xatlas::internal::BVH::Node]"
        ;
LAB_001ae8c1:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4a8,__function);
      }
      bVar3 = AABB::intersect(queryAabb,(AABB *)(puVar2 + (ulong)uVar8 * 0x24));
      if (bVar3) {
        local_138[uVar4] = uVar8;
        local_14c = uVar4;
      }
      uVar6 = iVar1 + uVar6;
      if ((this->m_nodes).m_base.size <= uVar6) goto LAB_001ae8ac;
      bVar3 = AABB::intersect(queryAabb,
                              (AABB *)((this->m_nodes).m_base.buffer + (ulong)uVar6 * 0x24));
      uVar4 = local_14c;
      if (bVar3) {
        local_138[(long)(int)local_14c + 1] = uVar6;
        uVar4 = local_14c + 1;
      }
    }
    if ((int)uVar4 < 0) {
      return;
    }
  } while( true );
}

Assistant:

void query(const AABB &queryAabb, Array<uint32_t> &result) const
	{
		result.clear();
		// Working set
		uint32_t todo[64];
		int32_t stackptr = 0;
		// "Push" on the root node to the working set
		todo[stackptr] = 0;
		while(stackptr >= 0) {
			// Pop off the next node to work on.
			const int ni = todo[stackptr--];
			const Node &node = m_nodes[ni];
			// Is leaf -> Intersect
			if (node.rightOffset == 0) {
				for(uint32_t o = 0; o < node.nPrims; ++o) {
					const uint32_t obj = node.start + o;
					if (queryAabb.intersect((*m_objectAabbs)[m_objectIds[obj]]))
						result.push_back(m_objectIds[obj]);
				}
			} else { // Not a leaf
				const uint32_t left = ni + 1;
				const uint32_t right = ni + node.rightOffset;
				if (queryAabb.intersect(m_nodes[left].aabb))
					todo[++stackptr] = left;
				if (queryAabb.intersect(m_nodes[right].aabb))
					todo[++stackptr] = right;
			}
		}
	}